

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptorProto::MergePartialFromCodedStream
          (FileDescriptorProto *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  ArenaStringPtr *this_03;
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  void *pvVar4;
  uint8 *puVar5;
  Arena *this_04;
  char *data;
  bool bVar6;
  uint32 uVar7;
  int iVar8;
  Type *this_05;
  Type *this_06;
  FileOptions *this_07;
  Type *this_08;
  Type *this_09;
  SourceCodeInfo *this_10;
  pair<int,_int> pVar9;
  string *psVar10;
  Type *pTVar11;
  RepeatedField<int> *pRVar12;
  UnknownFieldSet *unknown_fields;
  char cVar13;
  uint tag;
  ulong uVar14;
  Rep *pRVar15;
  
  this_01 = &this->syntax_;
  this_00 = &this->dependency_;
  this_02 = &this->package_;
  this_03 = &this->name_;
LAB_002f608d:
  pbVar3 = input->buffer_;
  uVar7 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar1 = *pbVar3;
    uVar7 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_002f60b1;
    input->buffer_ = pbVar3 + 1;
    uVar14 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_002f60b1:
    uVar7 = io::CodedInputStream::ReadTagFallback(input,uVar7);
    uVar14 = 0;
    if (uVar7 - 1 < 0x7f) {
      uVar14 = 0x100000000;
    }
    uVar14 = uVar7 | uVar14;
  }
  tag = (uint)uVar14;
  if ((uVar14 & 0x100000000) == 0) goto switchD_002f612c_default;
  cVar13 = (char)uVar14;
  switch((uint)(uVar14 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar13 == '\n') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      psVar10 = (this->name_).ptr_;
      if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_03,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar10 = this_03->ptr_;
      }
      bVar6 = internal::WireFormatLite::ReadBytes(input,psVar10);
      if (!bVar6) {
        return false;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_03->ptr_->_M_dataplus)._M_p,(int)this_03->ptr_->_M_string_length,PARSE,
                 "google.protobuf.FileDescriptorProto.name");
      goto LAB_002f608d;
    }
    break;
  case 2:
    if (cVar13 == '\x12') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      psVar10 = (this->package_).ptr_;
      if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_02,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar10 = this_02->ptr_;
      }
      bVar6 = internal::WireFormatLite::ReadBytes(input,psVar10);
      if (!bVar6) {
        return false;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_02->ptr_->_M_dataplus)._M_p,(int)this_02->ptr_->_M_string_length,PARSE,
                 "google.protobuf.FileDescriptorProto.package");
      goto LAB_002f608d;
    }
    break;
  case 3:
    if (cVar13 == '\x1a') {
      pRVar15 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar15 == (Rep *)0x0) {
        iVar8 = (this->dependency_).super_RepeatedPtrFieldBase.total_size_;
LAB_002f662a:
        internal::RepeatedPtrFieldBase::Reserve(&this_00->super_RepeatedPtrFieldBase,iVar8 + 1);
        pRVar15 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
        iVar8 = pRVar15->allocated_size;
LAB_002f663c:
        pRVar15->allocated_size = iVar8 + 1;
        this_04 = (this_00->super_RepeatedPtrFieldBase).arena_;
        if (this_04 == (Arena *)0x0) {
          psVar10 = (string *)operator_new(0x20);
          (psVar10->_M_dataplus)._M_p = (pointer)&psVar10->field_2;
          psVar10->_M_string_length = 0;
          (psVar10->field_2)._M_local_buf[0] = '\0';
        }
        else {
          psVar10 = (string *)
                    Arena::AllocateAligned
                              (this_04,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          (psVar10->_M_dataplus)._M_p = (pointer)&psVar10->field_2;
          psVar10->_M_string_length = 0;
          (psVar10->field_2)._M_local_buf[0] = '\0';
          Arena::AddListNode(this_04,psVar10,internal::arena_destruct_object<std::__cxx11::string>);
          pRVar15 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
        }
        iVar8 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
        (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
        pRVar15->elements[iVar8] = psVar10;
      }
      else {
        iVar2 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
        iVar8 = pRVar15->allocated_size;
        if (iVar8 <= iVar2) {
          if (iVar8 == (this->dependency_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_002f662a;
          goto LAB_002f663c;
        }
        (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        psVar10 = (string *)pRVar15->elements[iVar2];
      }
      bVar6 = internal::WireFormatLite::ReadBytes(input,psVar10);
      if (!bVar6) {
        return false;
      }
      pTVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_00->super_RepeatedPtrFieldBase,
                           (this->dependency_).super_RepeatedPtrFieldBase.current_size_ + -1);
      data = (pTVar11->_M_dataplus)._M_p;
      pTVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&this_00->super_RepeatedPtrFieldBase,
                           (this->dependency_).super_RepeatedPtrFieldBase.current_size_ + -1);
      internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar11->_M_string_length,PARSE,
                 "google.protobuf.FileDescriptorProto.dependency");
      goto LAB_002f608d;
    }
    break;
  case 4:
    if (cVar13 != '\"') break;
    this_06 = internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                        (&(this->message_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
      input->buffer_ = puVar5 + 1;
    }
    else {
      iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (iVar8 < 0) {
        return false;
      }
    }
    pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
    if ((long)pVar9 < 0) {
      return false;
    }
    bVar6 = DescriptorProto::MergePartialFromCodedStream(this_06,input);
LAB_002f65f8:
    if (bVar6 == false) {
      return false;
    }
    bVar6 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar9.first);
    if (!bVar6) {
      return false;
    }
    goto LAB_002f608d;
  case 5:
    if (cVar13 == '*') {
      this_05 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                          (&(this->enum_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
        input->buffer_ = puVar5 + 1;
      }
      else {
        iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar8 < 0) {
          return false;
        }
      }
      pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar6 = EnumDescriptorProto::MergePartialFromCodedStream(this_05,input);
      goto LAB_002f65f8;
    }
    break;
  case 6:
    if (cVar13 == '2') {
      this_08 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                          (&(this->service_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
        input->buffer_ = puVar5 + 1;
      }
      else {
        iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar8 < 0) {
          return false;
        }
      }
      pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar6 = ServiceDescriptorProto::MergePartialFromCodedStream(this_08,input);
      goto LAB_002f65f8;
    }
    break;
  case 7:
    if (cVar13 == ':') {
      this_09 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                          (&(this->extension_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
        input->buffer_ = puVar5 + 1;
      }
      else {
        iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar8 < 0) {
          return false;
        }
      }
      pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar6 = FieldDescriptorProto::MergePartialFromCodedStream(this_09,input);
      goto LAB_002f65f8;
    }
    break;
  case 8:
    if (cVar13 == 'B') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      this_07 = this->options_;
      if (this_07 == (FileOptions *)0x0) {
        this_07 = (FileOptions *)operator_new(0xb0);
        FileOptions::FileOptions(this_07);
        this->options_ = this_07;
      }
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
        input->buffer_ = puVar5 + 1;
      }
      else {
        iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar8 < 0) {
          return false;
        }
      }
      pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar6 = FileOptions::MergePartialFromCodedStream(this_07,input);
      goto LAB_002f65f8;
    }
    break;
  case 9:
    if (cVar13 == 'J') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      this_10 = this->source_code_info_;
      if (this_10 == (SourceCodeInfo *)0x0) {
        this_10 = (SourceCodeInfo *)operator_new(0x30);
        SourceCodeInfo::SourceCodeInfo(this_10);
        this->source_code_info_ = this_10;
      }
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
        input->buffer_ = puVar5 + 1;
      }
      else {
        iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar8 < 0) {
          return false;
        }
      }
      pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar6 = SourceCodeInfo::MergePartialFromCodedStream(this_10,input);
      goto LAB_002f65f8;
    }
    break;
  case 10:
    pRVar12 = &this->public_dependency_;
    if (cVar13 == 'R') {
LAB_002f64b5:
      bVar6 = internal::WireFormatLite::
              ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (input,pRVar12);
    }
    else {
      if ((tag & 0xff) != 0x50) break;
      uVar7 = 0x50;
LAB_002f643f:
      bVar6 = internal::WireFormatLite::
              ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (1,uVar7,input,pRVar12);
    }
    goto LAB_002f6108;
  case 0xb:
    pRVar12 = &this->weak_dependency_;
    if (cVar13 == 'Z') goto LAB_002f64b5;
    if ((tag & 0xff) == 0x58) {
      uVar7 = 0x58;
      goto LAB_002f643f;
    }
    break;
  case 0xc:
    if (cVar13 == 'b') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      psVar10 = (this->syntax_).ptr_;
      if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_01,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar10 = this_01->ptr_;
      }
      bVar6 = internal::WireFormatLite::ReadBytes(input,psVar10);
      if (!bVar6) {
        return false;
      }
      internal::WireFormatLite::VerifyUtf8String
                ((this_01->ptr_->_M_dataplus)._M_p,(int)this_01->ptr_->_M_string_length,PARSE,
                 "google.protobuf.FileDescriptorProto.syntax");
      goto LAB_002f608d;
    }
  }
switchD_002f612c_default:
  if (tag == 0) {
    return true;
  }
  if ((tag & 7) == 4) {
    return true;
  }
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) == 0) {
    unknown_fields =
         internal::
         InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
         ::mutable_unknown_fields_slow
                   (&(this->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   );
  }
  else {
    unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
  }
  bVar6 = internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_002f6108:
  if (bVar6 == false) {
    return false;
  }
  goto LAB_002f608d;
}

Assistant:

bool FileDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FileDescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string package = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_package()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->package().data(), this->package().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.package");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string dependency = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_dependency()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->dependency(this->dependency_size() - 1).data(),
            this->dependency(this->dependency_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.dependency");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto message_type = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_message_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.ServiceDescriptorProto service = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_service()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FileOptions options = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_source_code_info()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 public_dependency = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 80u, input, this->mutable_public_dependency())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(82u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_public_dependency())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 weak_dependency = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 88u, input, this->mutable_weak_dependency())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(90u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_weak_dependency())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string syntax = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(98u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_syntax()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->syntax().data(), this->syntax().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.FileDescriptorProto.syntax");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FileDescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FileDescriptorProto)
  return false;
#undef DO_
}